

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::BufferTest::Check<unsigned_int,2,false>(BufferTest *this)

{
  GLuint GVar1;
  ulong uVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  GLuint *pGVar6;
  ulong uVar7;
  allocator_type local_21;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&result,0xc,&local_21);
  (**(code **)(lVar5 + 0xff0))(0xcf5,4);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x486);
  (**(code **)(lVar5 + 0xff0))(0xd05,4);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x489);
  (**(code **)(lVar5 + 0x1228))(0,0,6,1,0x8228,0x1405,0x30);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x48d);
  pGVar6 = Reference::ReferenceData<unsigned_int,_false>::reference;
  uVar2 = 0;
  do {
    uVar7 = uVar2;
    if (uVar7 == 0xc) break;
    GVar1 = *pGVar6;
    pGVar6 = pGVar6 + 1;
    uVar2 = uVar7 + 1;
  } while (result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar7] == GVar1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return 0xb < uVar7;
}

Assistant:

bool BufferTest::Check()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetching data. */
	std::vector<T> result(TestReferenceDataCount<S>());

	gl.pixelStorei(GL_UNPACK_ALIGNMENT, sizeof(T));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	gl.pixelStorei(GL_PACK_ALIGNMENT, sizeof(T));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	gl.readnPixels(0, 0, s_fbo_size_x, s_fbo_size_y, Format<S, N>(), Type<T>(), TestReferenceDataSize<T, S>(),
				   (glw::GLvoid*)(&result[0]));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

	/* Comparison. */
	bool is_ok = true;

	for (glw::GLuint i = 0; i < TestReferenceDataCount<S>(); ++i)
	{
		if (!Compare<T>(result[i], ReferenceData<T, N>()[i]))
		{
			is_ok = false;

			break;
		}
	}

	return is_ok;
}